

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O0

void explicit_suite::visit_boolean(void)

{
  undefined4 local_50 [4];
  value local_40;
  visitor local_39;
  undefined1 local_38 [7];
  visitor vis;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,true);
  local_40 = trial::dynamic::visit<explicit_suite::visitor&,std::allocator<char>>
                       (&local_39,(basic_variable<std::allocator<char>_> *)local_38);
  local_50[0] = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x8f,"void explicit_suite::visit_boolean()",&local_40,local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void visit_boolean()
{
    variable data(true);
    visitor vis;
    TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::boolean);
}